

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindConcatFunctionInternal
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,bool is_operator)

{
  LogicalTypeId LVar1;
  pointer puVar2;
  duckdb *pdVar3;
  bool bVar4;
  pointer pEVar5;
  LogicalType *pLVar6;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> extraout_RAX;
  ConcatFunctionData *pCVar7;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> extraout_RAX_00;
  ParameterNotResolvedException *pPVar8;
  BinderException *pBVar9;
  type pEVar10;
  reference this_00;
  byte bVar11;
  size_type __n;
  pointer puVar12;
  string type_list;
  LogicalType next_type;
  LogicalType child_type;
  string local_e0;
  uint local_bc;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_b8;
  string local_b0;
  LogicalType local_90;
  duckdb *local_78;
  ClientContext *local_70;
  LogicalType local_68;
  string local_50;
  
  puVar12 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar11 = is_operator;
  local_b8 = arguments;
  local_70 = context;
  if (puVar12 != puVar2) {
    bVar4 = false;
    do {
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar12);
      if ((pEVar5->return_type).id_ == UNKNOWN) {
        pPVar8 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(pPVar8);
        __cxa_throw(pPVar8,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar12);
      if (((pEVar5->return_type).id_ == LIST) ||
         (pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(puVar12), (pEVar5->return_type).id_ == ARRAY)) {
        bVar4 = true;
      }
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar12);
      bVar11 = bVar11 & (pEVar5->return_type).id_ == BLOB;
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar2);
    if (bVar4) {
      local_78 = this;
      LogicalType::LogicalType(&local_68,SQLNULL);
      puVar12 = (local_b8->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (local_b8->
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar12 == puVar2) {
LAB_009f076c:
        LogicalType::LogicalType((LogicalType *)&local_e0,SQLNULL);
        SetArgumentType(bound_function,(LogicalType *)&local_e0,is_operator);
        LogicalType::~LogicalType((LogicalType *)&local_e0);
        pCVar7 = (ConcatFunctionData *)operator_new(0x28);
        pdVar3 = local_78;
        ConcatFunctionData::ConcatFunctionData
                  (pCVar7,&(bound_function->super_BaseScalarFunction).return_type,is_operator);
        *(ConcatFunctionData **)pdVar3 = pCVar7;
      }
      else {
        local_bc = (uint)CONCAT71((int7)((ulong)local_b8 >> 8),1);
        do {
          while( true ) {
            pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(puVar12);
            LogicalType::LogicalType((LogicalType *)&local_e0,SQLNULL);
            pLVar6 = &pEVar5->return_type;
            bVar4 = LogicalType::operator==(pLVar6,(LogicalType *)&local_e0);
            LogicalType::~LogicalType((LogicalType *)&local_e0);
            if (!bVar4) break;
            puVar12 = puVar12 + 1;
            if (puVar12 == puVar2) {
              if ((local_bc & 1) != 0) goto LAB_009f076c;
              goto LAB_009f07c5;
            }
          }
          LogicalType::LogicalType(&local_90,INVALID);
          LVar1 = pLVar6->id_;
          if (LVar1 == LIST) {
            pLVar6 = ListType::GetChildType(pLVar6);
          }
          else {
            if (LVar1 != ARRAY) {
              if (LVar1 != UNKNOWN) {
                local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                local_e0._M_string_length = 0;
                local_e0.field_2._M_local_buf[0] = '\0';
                if ((local_b8->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (local_b8->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  __n = 0;
                  do {
                    if (local_e0._M_string_length != 0) {
                      ::std::__cxx11::string::append((char *)&local_e0);
                    }
                    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              ::operator[](local_b8,__n);
                    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             ::operator->(this_00);
                    LogicalType::ToString_abi_cxx11_(&local_b0,&pEVar5->return_type);
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_e0,(ulong)local_b0._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p);
                    }
                    __n = __n + 1;
                  } while (__n < (ulong)((long)(local_b8->
                                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               ).
                                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(local_b8->
                                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               ).
                                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3));
                }
                pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
                pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator*(puVar12);
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b0,
                           "Cannot concatenate types %s - an explicit cast is required","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,local_e0._M_dataplus._M_p,
                           local_e0._M_dataplus._M_p + local_e0._M_string_length);
                BinderException::BinderException<std::__cxx11::string>
                          (pBVar9,pEVar10,&local_b0,&local_50);
                __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
              }
              pPVar8 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
              ParameterNotResolvedException::ParameterNotResolvedException(pPVar8);
              __cxa_throw(pPVar8,&ParameterNotResolvedException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            pLVar6 = ArrayType::GetChildType(pLVar6);
          }
          if (&local_90 != pLVar6) {
            local_90.id_ = pLVar6->id_;
            local_90.physical_type_ = pLVar6->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&local_90.type_info_,&pLVar6->type_info_);
          }
          bVar4 = LogicalType::TryGetMaxLogicalType(local_70,&local_68,&local_90,&local_68);
          if (!bVar4) {
            pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
            pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(puVar12);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,
                       "Cannot concatenate lists of types %s[] and %s[] - an explicit cast is required"
                       ,"");
            LogicalType::ToString_abi_cxx11_(&local_b0,&local_68);
            LogicalType::ToString_abi_cxx11_(&local_50,&local_90);
            BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                      (pBVar9,pEVar10,&local_e0,&local_b0,&local_50);
            __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          LogicalType::~LogicalType(&local_90);
          puVar12 = puVar12 + 1;
          local_bc = 0;
        } while (puVar12 != puVar2);
LAB_009f07c5:
        LogicalType::LIST((LogicalType *)&local_e0,&local_68);
        SetArgumentType(bound_function,(LogicalType *)&local_e0,is_operator);
        pCVar7 = (ConcatFunctionData *)operator_new(0x28);
        pdVar3 = local_78;
        ConcatFunctionData::ConcatFunctionData
                  (pCVar7,&(bound_function->super_BaseScalarFunction).return_type,is_operator);
        *(ConcatFunctionData **)pdVar3 = pCVar7;
        LogicalType::~LogicalType((LogicalType *)&local_e0);
      }
      LogicalType::~LogicalType(&local_68);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             extraout_RAX_00._M_t.
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_e0,bVar11 + VARCHAR);
  SetArgumentType(bound_function,(LogicalType *)&local_e0,is_operator);
  LogicalType::~LogicalType((LogicalType *)&local_e0);
  pCVar7 = (ConcatFunctionData *)operator_new(0x28);
  ConcatFunctionData::ConcatFunctionData
            (pCVar7,&(bound_function->super_BaseScalarFunction).return_type,is_operator);
  *(ConcatFunctionData **)this = pCVar7;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         extraout_RAX._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> BindConcatFunctionInternal(ClientContext &context, ScalarFunction &bound_function,
                                                           vector<unique_ptr<Expression>> &arguments,
                                                           bool is_operator) {
	bool list_concat = false;
	// blob concat is only supported for the concat operator - regular concat converts to varchar
	bool all_blob = is_operator ? true : false;
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
		if (arg->return_type.id() == LogicalTypeId::LIST || arg->return_type.id() == LogicalTypeId::ARRAY) {
			list_concat = true;
		}
		if (arg->return_type.id() != LogicalTypeId::BLOB) {
			all_blob = false;
		}
	}
	if (list_concat) {
		return BindListConcat(context, bound_function, arguments, is_operator);
	}
	auto return_type = all_blob ? LogicalType::BLOB : LogicalType::VARCHAR;

	// we can now assume that the input is a string or castable to a string
	SetArgumentType(bound_function, return_type, is_operator);
	return make_uniq<ConcatFunctionData>(bound_function.return_type, is_operator);
}